

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

void __thiscall
ear::Layout::checkPositions
          (Layout *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *callback)

{
  bool bVar1;
  reference this_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58;
  reference local_38;
  Channel *channel;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *__range1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *callback_local;
  Layout *this_local;
  
  __end1 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(&this->_channels);
  channel = (Channel *)
            std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(&this->_channels);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                                *)&channel);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
              ::operator*(&__end1);
    local_38 = this_00;
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_58,callback);
    Channel::checkPosition(this_00,&local_58);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_58);
    __gnu_cxx::
    __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Layout::checkPositions(
      std::function<void(const std::string&)> callback) const {
    for (const auto& channel : _channels) {
      channel.checkPosition(callback);
    }
  }